

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  file_type fVar4;
  size_type sVar5;
  reference p_00;
  ulong uVar6;
  error_code eVar7;
  bool local_2a1;
  path local_280;
  undefined1 local_260 [8];
  path target;
  path local_238;
  file_status local_218;
  file_status sls;
  string local_1f0;
  path local_1d0;
  path local_1b0;
  byte local_189;
  path local_188;
  undefined1 local_168 [8];
  path pe;
  iterator __end3;
  undefined1 local_f0 [8];
  iterator __begin3;
  path *__range3;
  size_type rootPathLen;
  undefined4 uStack_8c;
  bool redo;
  int local_7c;
  file_status local_78;
  file_status fs;
  path result;
  path work;
  error_code *ec_local;
  path *p_local;
  
  bVar1 = path::empty(p);
  if (bVar1) {
    eVar7 = detail::make_error_code(not_found);
    *(ulong *)ec = CONCAT44(work._path.field_2._12_4_,eVar7._M_value);
    ec->_M_cat = eVar7._M_cat;
    path::path(__return_storage_ptr__);
  }
  else {
    bVar1 = path::is_absolute(p);
    if (bVar1) {
      path::path((path *)((long)&result._path.field_2 + 8),p);
    }
    else {
      absolute((path *)((long)&result._path.field_2 + 8),p,ec);
    }
    path::path((path *)&fs);
    status((filesystem *)&local_78,(path *)((long)&result._path.field_2 + 8),ec);
    bVar1 = std::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      path::path(__return_storage_ptr__);
    }
    else {
      fVar4 = file_status::type(&local_78);
      if (fVar4 == not_found) {
        eVar7 = detail::make_error_code(not_found);
        *(ulong *)ec = CONCAT44(uStack_8c,eVar7._M_value);
        ec->_M_cat = eVar7._M_cat;
        path::path(__return_storage_ptr__);
      }
      else {
        do {
          this = (path *)(&result._path.field_2._M_allocated_capacity + 1);
          sVar5 = path::root_name_length(this);
          bVar2 = path::has_root_directory(this);
          bVar1 = false;
          path::clear((path *)&fs);
          __begin3._current._path.field_2._8_8_ = this;
          path::begin((iterator *)local_f0,this);
          path::end((iterator *)((long)&pe._path.field_2 + 8),
                    (path *)__begin3._current._path.field_2._8_8_);
          while (bVar3 = path::iterator::operator!=
                                   ((iterator *)local_f0,(iterator *)((long)&pe._path.field_2 + 8)),
                bVar3) {
            p_00 = path::iterator::operator*((iterator *)local_f0);
            path::path((path *)local_168,p_00);
            bVar3 = path::empty((path *)local_168);
            local_189 = 0;
            local_2a1 = true;
            if (!bVar3) {
              path::path<char[2],ghc::filesystem::path>
                        (&local_188,(char (*) [2])0x48ca25,auto_format);
              local_189 = 1;
              local_2a1 = operator==((path *)local_168,&local_188);
            }
            if ((local_189 & 1) != 0) {
              path::~path(&local_188);
            }
            if (local_2a1 == false) {
              path::path<char[3],ghc::filesystem::path>
                        (&local_1b0,(char (*) [3])0x3aa79c,auto_format);
              bVar3 = operator==((path *)local_168,&local_1b0);
              path::~path(&local_1b0);
              if (bVar3) {
                path::parent_path(&local_1d0,(path *)&fs);
                path::operator=((path *)&fs,&local_1d0);
                path::~path(&local_1d0);
                local_7c = 5;
              }
              else {
                operator/((path *)&sls,(path *)&fs,(path *)local_168);
                path::string_abi_cxx11_(&local_1f0,(path *)&sls);
                uVar6 = std::__cxx11::string::length();
                std::__cxx11::string::~string((string *)&local_1f0);
                path::~path((path *)&sls);
                if (sVar5 + bVar2 < uVar6) {
                  operator/(&local_238,(path *)&fs,(path *)local_168);
                  symlink_status((filesystem *)&local_218,&local_238,ec);
                  path::~path(&local_238);
                  bVar3 = std::error_code::operator_cast_to_bool(ec);
                  if (bVar3) {
                    path::path(__return_storage_ptr__);
                    local_7c = 1;
                  }
                  else {
                    file_status::file_status
                              ((file_status *)((long)&target._path.field_2 + 8),&local_218);
                    bVar3 = is_symlink((file_status *)((long)&target._path.field_2 + 8));
                    file_status::~file_status((file_status *)((long)&target._path.field_2 + 8));
                    if (bVar3) {
                      bVar1 = true;
                      operator/(&local_280,(path *)&fs,(path *)local_168);
                      read_symlink((path *)local_260,&local_280,ec);
                      path::~path(&local_280);
                      bVar3 = std::error_code::operator_cast_to_bool(ec);
                      if (bVar3) {
                        path::path(__return_storage_ptr__);
                        local_7c = 1;
                      }
                      else {
                        bVar3 = path::is_absolute((path *)local_260);
                        if (bVar3) {
                          path::operator=((path *)&fs,(path *)local_260);
                          local_7c = 5;
                        }
                        else {
                          path::operator/=((path *)&fs,(path *)local_260);
                          local_7c = 5;
                        }
                      }
                      path::~path((path *)local_260);
                    }
                    else {
                      path::operator/=((path *)&fs,(path *)local_168);
                      local_7c = 0;
                    }
                  }
                  file_status::~file_status(&local_218);
                  if (local_7c == 0) {
                    local_7c = 0;
                  }
                }
                else {
                  path::operator/=((path *)&fs,(path *)local_168);
                  local_7c = 5;
                }
              }
            }
            else {
              local_7c = 5;
            }
            path::~path((path *)local_168);
            if ((local_7c != 0) && (local_7c != 5)) goto LAB_002c90b6;
            path::iterator::operator++((iterator *)local_f0);
          }
          local_7c = 4;
LAB_002c90b6:
          path::iterator::~iterator((iterator *)((long)&pe._path.field_2 + 8));
          path::iterator::~iterator((iterator *)local_f0);
          if (local_7c != 4) goto LAB_002c9130;
          path::operator=((path *)((long)&result._path.field_2 + 8),(path *)&fs);
        } while (bVar1);
        std::error_code::clear(ec);
        path::path(__return_storage_ptr__,(path *)&fs);
      }
    }
LAB_002c9130:
    file_status::~file_status(&local_78);
    path::~path((path *)&fs);
    path::~path((path *)((long)&result._path.field_2 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}